

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void __thiscall hypermind::Token::dump(Token *this,Ostream *os)

{
  uint uVar1;
  char *pcVar2;
  allocator local_69;
  string local_68 [48];
  string local_38 [8];
  String name;
  Ostream *os_local;
  Token *this_local;
  
  std::__cxx11::string::string(local_38);
  switch(this->type) {
  case End:
    std::__cxx11::string::operator=(local_38,"<end>");
    break;
  case Delimiter:
    std::__cxx11::string::operator=(local_38,"<delimiter>");
    break;
  case Number:
  case Identifier:
    pcVar2 = this->start;
    uVar1 = this->length;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,pcVar2,(ulong)uVar1,&local_69);
    std::__cxx11::string::operator=(local_38,local_68);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    break;
  case String:
    break;
  case Dot:
    std::__cxx11::string::operator=(local_38,".");
    break;
  case Comma:
    std::__cxx11::string::operator=(local_38,",");
    break;
  case LeftParen:
    std::__cxx11::string::operator=(local_38,"(");
    break;
  case RightParen:
    std::__cxx11::string::operator=(local_38,")");
    break;
  case LeftBracket:
    std::__cxx11::string::operator=(local_38,"[");
    break;
  case RightBracket:
    std::__cxx11::string::operator=(local_38,"]");
    break;
  case LeftBrace:
    std::__cxx11::string::operator=(local_38,"{");
    break;
  case RightBrace:
    std::__cxx11::string::operator=(local_38,"}");
    break;
  case Add:
    std::__cxx11::string::operator=(local_38,"+");
    break;
  case Sub:
    std::__cxx11::string::operator=(local_38,"-");
    break;
  case Mul:
    std::__cxx11::string::operator=(local_38,"*");
    break;
  case Div:
    std::__cxx11::string::operator=(local_38,"/");
    break;
  case Increase:
    std::__cxx11::string::operator=(local_38,"++");
    break;
  case Decrease:
    std::__cxx11::string::operator=(local_38,"--");
    break;
  case Assign:
    std::__cxx11::string::operator=(local_38,"=");
    break;
  case AddAssign:
    std::__cxx11::string::operator=(local_38,"+=");
    break;
  case SubAssign:
    std::__cxx11::string::operator=(local_38,"-=");
    break;
  case MulAssign:
    std::__cxx11::string::operator=(local_38,"*=");
    break;
  case DivAssign:
    std::__cxx11::string::operator=(local_38,"/=");
    break;
  case ModAssign:
    std::__cxx11::string::operator=(local_38,"%=");
    break;
  case AndAssign:
    std::__cxx11::string::operator=(local_38,"&=");
    break;
  case OrAssign:
    std::__cxx11::string::operator=(local_38,"|=");
    break;
  case XorAssign:
    std::__cxx11::string::operator=(local_38,"^=");
    break;
  case Arrow:
    std::__cxx11::string::operator=(local_38,"->");
    break;
  case Not:
    std::__cxx11::string::operator=(local_38,"!");
    break;
  case Equal:
    std::__cxx11::string::operator=(local_38,"==");
    break;
  case NotEqual:
    std::__cxx11::string::operator=(local_38,"!=");
    break;
  case Greater:
    std::__cxx11::string::operator=(local_38,">");
    break;
  case Less:
    std::__cxx11::string::operator=(local_38,"<");
    break;
  case GreaterEqual:
    std::__cxx11::string::operator=(local_38,">=");
    break;
  case LessEqual:
    std::__cxx11::string::operator=(local_38,"<=");
    break;
  case Or:
    std::__cxx11::string::operator=(local_38,"|");
    break;
  case LogicOr:
    std::__cxx11::string::operator=(local_38,"||");
    break;
  case And:
    std::__cxx11::string::operator=(local_38,"&");
    break;
  case LogicAnd:
    std::__cxx11::string::operator=(local_38,"&&");
    break;
  case Mod:
    std::__cxx11::string::operator=(local_38,"%");
    break;
  case At:
    std::__cxx11::string::operator=(local_38,"@");
    break;
  case Colon:
    std::__cxx11::string::operator=(local_38,":");
    break;
  default:
    std::__cxx11::string::operator=(local_38,"<unknown>");
    break;
  case KeywordNew:
    std::__cxx11::string::operator=(local_38,"new");
  }
  std::operator<<(os,local_38);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void Token::dump(Ostream &os) const {
#define TOKEN_DUMP(v) name = _HM_C(v);
        String name;
        switch (type) {
            case TokenType::End:
                TOKEN_DUMP("<end>");
                break;
            case TokenType::Delimiter:
                TOKEN_DUMP("<delimiter>");
                break;
            case TokenType::Add:
                TOKEN_DUMP("+");
                break;
            case TokenType::Sub:
                TOKEN_DUMP("-");
                break;
            case TokenType::Mul:
                TOKEN_DUMP("*");
                break;
            case TokenType::Div:
                TOKEN_DUMP("/");
                break;
            case TokenType::Identifier:
            case TokenType::Number:
                name = String(start, length);
                break;
            case TokenType::String:
                break;
            case TokenType::Dot:
                TOKEN_DUMP(".");
                break;
            case TokenType::Comma:
                TOKEN_DUMP(",");
                break;
            case TokenType::LeftParen:
                TOKEN_DUMP("(");
                break;
            case TokenType::RightParen:
                TOKEN_DUMP(")");
                break;
            case TokenType::LeftBracket:
                TOKEN_DUMP("[");
                break;
            case TokenType::RightBracket:
                TOKEN_DUMP("]");
                break;
            case TokenType::LeftBrace:
                TOKEN_DUMP("{");
                break;
            case TokenType::RightBrace:
                TOKEN_DUMP("}");
                break;
            case TokenType::Increase:
                TOKEN_DUMP("++");
                break;
            case TokenType::Decrease:
                TOKEN_DUMP("--");
                break;
            case TokenType::Assign:
                TOKEN_DUMP("=");
                break;
            case TokenType::AddAssign:
                TOKEN_DUMP("+=");
                break;
            case TokenType::SubAssign:
                TOKEN_DUMP("-=");
                break;
            case TokenType::MulAssign:
                TOKEN_DUMP("*=");
                break;
            case TokenType::DivAssign:
                TOKEN_DUMP("/=");
                break;
            case TokenType::ModAssign:
                TOKEN_DUMP("%=");
                break;
            case TokenType::AndAssign:
                TOKEN_DUMP("&=");
                break;
            case TokenType::OrAssign:
                TOKEN_DUMP("|=");
                break;
            case TokenType::XorAssign:
                TOKEN_DUMP("^=");
                break;
            case TokenType::Arrow:
                TOKEN_DUMP("->");
                break;
            case TokenType::Not:
                TOKEN_DUMP("!");
                break;
            case TokenType::Equal:
                TOKEN_DUMP("==");
                break;
            case TokenType::NotEqual:
                TOKEN_DUMP("!=");
                break;
            case TokenType::Greater:
                TOKEN_DUMP(">");
                break;
            case TokenType::Less:
                TOKEN_DUMP("<");
                break;
            case TokenType::GreaterEqual:
                TOKEN_DUMP(">=");
                break;
            case TokenType::LessEqual:
                TOKEN_DUMP("<=");
                break;
            case TokenType::Or:
                TOKEN_DUMP("|");
                break;
            case TokenType::LogicOr:
                TOKEN_DUMP("||");
                break;
            case TokenType::And:
                TOKEN_DUMP("&");
                break;
            case TokenType::LogicAnd:
                TOKEN_DUMP("&&");
                break;
            case TokenType::Mod:
                TOKEN_DUMP("%");
                break;
            case TokenType::At:
                TOKEN_DUMP("@");
                break;
            case TokenType::Colon:
                TOKEN_DUMP(":");
                break;
            case TokenType::KeywordNew:
                TOKEN_DUMP("new");
                break;
            default:
                TOKEN_DUMP("<unknown>");
        }
        os << name ;
#undef TOKEN_DUMP

    }